

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

Instr * __thiscall LinearScan::InsertLoad(LinearScan *this,Instr *instr,StackSym *sym,RegNum reg)

{
  IRType type;
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint32 number;
  uint uVar4;
  uint functionId;
  undefined4 *puVar5;
  SymOpnd *src;
  StackSym *sym_00;
  RegOpnd *pRVar6;
  Instr *instr_00;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  uint uVar7;
  uint uVar8;
  StackSym *oldSym;
  
  type = sym->m_type;
  bVar3 = StackSym::IsConst(sym);
  if (bVar3) {
    if ((sym->field_0x19 & 0x10) != 0) {
      bVar3 = IsSymNonTempLocalVar(this,sym);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0xc9b,"(!sym->IsAllocated() || IsSymNonTempLocalVar(sym))",
                           "!sym->IsAllocated() || IsSymNonTempLocalVar(sym)");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
    }
    src = (SymOpnd *)StackSym::GetConstOpnd(sym);
    sym_00 = StackSym::New(sym->m_type,this->func);
    uVar1 = *(uint *)&sym_00->field_0x18;
    if (src == (SymOpnd *)0x0) {
      *(uint *)&sym_00->field_0x18 = uVar1 | 0x108;
      pRVar6 = IR::RegOpnd::New(sym_00,reg,type,this->func);
      instr_00 = IR::Instr::New(MOVSD_ZERO,&pRVar6->super_Opnd,this->func);
      IR::Instr::InsertBefore(instr,instr_00);
      goto LAB_00586486;
    }
    *(uint *)&sym_00->field_0x18 = uVar1 | 8;
    uVar7 = *(uint *)&sym->field_0x18 & 0x10;
    *(uint *)&sym_00->field_0x18 = uVar1 & 0xffffffef | 8 | uVar7;
    uVar8 = *(uint *)&sym->field_0x18 & 0x80;
    *(uint *)&sym_00->field_0x18 = uVar1 & 0xffffff6f | 8 | uVar7 | uVar8;
    *(uint *)&sym_00->field_0x18 =
         uVar1 & 0xffffff4f | 8 | uVar7 | uVar8 | *(uint *)&sym->field_0x18 & 0x20;
  }
  else {
    src = IR::SymOpnd::New(&sym->super_Sym,type,this->func);
    sym_00 = sym;
  }
  pRVar6 = IR::RegOpnd::New(sym_00,reg,type,this->func);
  instr_00 = Lowerer::InsertMove(&pRVar6->super_Opnd,&src->super_Opnd,instr,true);
LAB_00586486:
  number = IR::Instr::GetNumber(instr);
  IR::Instr::SetNumber(instr_00,number);
  RecordLoopUse(this,(Lifetime *)0x0,reg);
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar4 = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,LinearScanPhase,uVar4,functionId);
  if (bVar3) {
    Output::Print(L"...Inserting load for ");
    Sym::Dump(&sym_00->super_Sym,(ValueType)0x9);
    if (sym_00->scratch == (anon_union_8_3_6c1fdb8e_for_scratch)0x0) {
      Output::Print(L"\n");
    }
    else {
      uVar4 = GetSpillCost(this,(Lifetime *)sym_00->scratch);
      Output::Print(L"  Cost:%d\n",(ulong)uVar4);
    }
  }
  return instr_00;
}

Assistant:

IR::Instr*
LinearScan::InsertLoad(IR::Instr *instr, StackSym *sym, RegNum reg)
{
    IR::Opnd *src;
    // The size of loads and stores to memory need to match. See the comment
    // around type in InsertStore above.
    IRType type = sym->GetType();

    bool isMovSDZero = false;
    if (sym->IsConst())
    {
        Assert(!sym->IsAllocated() || IsSymNonTempLocalVar(sym));
        // For an intConst, reload the constant instead of using the stack.
        // Create a new StackSym to make sure the old sym remains singleDef
        src = sym->GetConstOpnd();
        if (!src)
        {
            isMovSDZero = true;
            sym = StackSym::New(sym->GetType(), this->func);
            sym->m_isConst = true;
            sym->m_isFltConst = true;
        }
        else
        {
            StackSym * oldSym = sym;
            sym = StackSym::New(sym->GetType(), this->func);
            sym->m_isConst = true;
            sym->m_isIntConst = oldSym->m_isIntConst;
            sym->m_isInt64Const = oldSym->m_isInt64Const;
            sym->m_isTaggableIntConst = oldSym->m_isTaggableIntConst;
        }
    }
    else
    {
        src = IR::SymOpnd::New(sym, type, this->func);
    }
    IR::Instr * load;
#if defined(_M_IX86) || defined(_M_X64)
    if (isMovSDZero)
    {
        load = IR::Instr::New(Js::OpCode::MOVSD_ZERO,
            IR::RegOpnd::New(sym, reg, type, this->func), this->func);
        instr->InsertBefore(load);
    }
    else
#endif
    {
        load = Lowerer::InsertMove(IR::RegOpnd::New(sym, reg, type, this->func), src, instr);
    }
    load->CopyNumber(instr);
    if (!isMovSDZero)
    {
        this->linearScanMD.LegalizeUse(load, src);
    }

    this->RecordLoopUse(nullptr, reg);

#if DBG_DUMP
    if (PHASE_TRACE(Js::LinearScanPhase, this->func))
    {
        Output::Print(_u("...Inserting load for "));
        sym->Dump();
        if (sym->scratch.linearScan.lifetime)
        {
            Output::Print(_u("  Cost:%d\n"), this->GetSpillCost(sym->scratch.linearScan.lifetime));
        }
        else
        {
            Output::Print(_u("\n"));
        }
    }
#endif

    return load;
}